

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

void Gudhi::persistence_matrix::swap
               (List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                *col1,List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                      *col2)

{
  List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  *col2_local;
  List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
  *col1_local;
  
  swap((Dummy_row_access *)col1,(Dummy_row_access *)col2);
  swap(&col1->super_Column_dimension_option,&col2->super_Column_dimension_option);
  swap(&col1->super_Chain_column_option,&col2->super_Chain_column_option);
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
  ::swap(&col1->column_,&col2->column_);
  std::swap<Gudhi::persistence_fields::Z2_field_operators*>(&col1->operators_,&col2->operators_);
  std::
  swap<Gudhi::persistence_matrix::New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>*>
            (&col1->entryPool_,&col2->entryPool_);
  return;
}

Assistant:

void swap(List_column& col1, List_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }